

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-make.c
# Opt level: O1

void get_mon_num_prep(_func__Bool_monster_race_ptr *get_mon_num_hook)

{
  alloc_entry *paVar1;
  _Bool _Var2;
  undefined4 uVar3;
  long lVar4;
  long lVar5;
  
  if (0 < alloc_race_size) {
    lVar4 = 0xc;
    lVar5 = 0;
    do {
      paVar1 = alloc_race_table;
      if (get_mon_num_hook == (_func__Bool_monster_race_ptr *)0x0) {
LAB_0017b34a:
        uVar3 = *(undefined4 *)((long)paVar1 + lVar4 + -4);
      }
      else {
        _Var2 = (*get_mon_num_hook)(r_info + *(int *)((long)alloc_race_table + lVar4 + -0xc));
        uVar3 = 0;
        if (_Var2) goto LAB_0017b34a;
      }
      *(undefined4 *)((long)&paVar1->index + lVar4) = uVar3;
      lVar5 = lVar5 + 1;
      lVar4 = lVar4 + 0x14;
    } while (lVar5 < alloc_race_size);
  }
  return;
}

Assistant:

void get_mon_num_prep(bool (*get_mon_num_hook)(struct monster_race *race))
{
	int i;

	/* Scan the allocation table */
	for (i = 0; i < alloc_race_size; i++) {
		alloc_entry *entry = &alloc_race_table[i];

		/* Check the restriction, if any */
		if (!get_mon_num_hook || (*get_mon_num_hook)(&r_info[entry->index])) {
			/* Accept this monster */
			entry->prob2 = entry->prob1;

		} else {
			/* Do not use this monster */
			entry->prob2 = 0;
		}
	}
}